

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cuboctahedron.hpp
# Opt level: O1

void __thiscall OpenMD::Cuboctahedron::~Cuboctahedron(Cuboctahedron *this)

{
  ~Cuboctahedron(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

virtual ~Cuboctahedron() = default;